

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::add(Solver *this,int lit)

{
  State *pSVar1;
  uint in_ESI;
  Solver *in_RDI;
  Solver *unaff_retaddr;
  int in_stack_0000005c;
  External *in_stack_00000060;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call(unaff_retaddr,&in_RDI->adding_clause,in_ESI);
  }
  require_solver_pointer_to_be_non_zero
            ((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&in_RDI->adding_clause,
             (char *)0xe214d5);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if ((in_ESI != 0) && ((in_ESI == 0 || (in_ESI == 0x80000000)))) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"invalid literal \'%d\'",(ulong)in_ESI);
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  transition_to_steady_state((Solver *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  External::add(in_stack_00000060,in_stack_0000005c);
  in_RDI->adding_clause = in_ESI != 0;
  if ((in_RDI->adding_clause & 1U) == 0) {
    if (((in_RDI->adding_constraint & 1U) == 0) && (in_RDI->_state != STEADY)) {
      in_RDI->_state = STEADY;
    }
  }
  else if (in_RDI->_state != ADDING) {
    in_RDI->_state = ADDING;
  }
  return;
}

Assistant:

void Solver::add (int lit) {
  TRACE ("add", lit);
  REQUIRE_VALID_STATE ();
  if (lit)
    REQUIRE_VALID_LIT (lit);
  transition_to_steady_state ();
  external->add (lit);
  adding_clause = lit;
  if (adding_clause)
    STATE (ADDING);
  else if (!adding_constraint)
    STATE (STEADY);
  LOG_API_CALL_END ("add", lit);
}